

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpvtt.cc
# Opt level: O3

int main(int argc,char **argv)

{
  payload_t *this;
  _List_node_base *p_Var1;
  int iVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  settings_t *this_00;
  ulong uVar4;
  VttReader reader;
  Parser parser;
  Cue cue;
  VttReader VStack_c8;
  Parser local_b8;
  Cue local_a0;
  
  if (argc == 2) {
    libwebvtt::VttReader::VttReader(&VStack_c8);
    iVar2 = libwebvtt::VttReader::Open(&VStack_c8,argv[1]);
    if (iVar2 == 0) {
      libwebvtt::Parser::Parser(&local_b8,&VStack_c8.super_Reader);
      iVar2 = libwebvtt::Parser::Init(&local_b8);
      if (iVar2 == 0) {
        local_a0.identifier._M_dataplus._M_p = (pointer)&local_a0.identifier.field_2;
        local_a0.identifier._M_string_length = 0;
        local_a0.identifier.field_2._M_local_buf[0] = '\0';
        local_a0.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0.settings;
        local_a0.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node._M_size = 0;
        this = &local_a0.payload;
        local_a0.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size = 0;
        local_a0.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node.super__List_node_base._M_prev =
             local_a0.settings.
             super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl.
             _M_node.super__List_node_base._M_next;
        local_a0.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
        local_a0.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
        while( true ) {
          this_00 = &local_a0.settings;
          iVar2 = libwebvtt::Parser::Parse(&local_b8,&local_a0);
          if (iVar2 < 0) break;
          if (iVar2 != 0) {
            iVar2 = 0;
            goto LAB_001034c1;
          }
          fprintf(_stdout,"cue identifier: \"%s\"\n",local_a0.identifier._M_dataplus._M_p);
          fprintf(_stdout,"cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",
                  (ulong)(uint)local_a0.start_time.hours,(ulong)(uint)local_a0.start_time.minutes,
                  (ulong)(uint)local_a0.start_time.seconds,
                  (ulong)(uint)local_a0.start_time.milliseconds);
          fprintf(_stdout,"cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",
                  (ulong)(uint)local_a0.stop_time.hours,(ulong)(uint)local_a0.stop_time.minutes,
                  (ulong)(uint)local_a0.stop_time.seconds,
                  (ulong)(uint)local_a0.stop_time.milliseconds);
          p_Var3 = local_a0.settings.
                   super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl
                   ._M_node.super__List_node_base._M_next;
          if (local_a0.settings.
              super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl.
              _M_node.super__List_node_base._M_next == (_List_node_base *)this_00) {
            fwrite("cue setting: <no settings present>\n",0x23,1,_stdout);
          }
          else {
            do {
              p_Var1 = (((_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)
                        &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              fprintf(_stdout,"cue setting: name=%s value=%s\n",p_Var3[1]._M_next,p_Var3[3]._M_next)
              ;
              p_Var3 = p_Var1;
            } while (p_Var1 != (_List_node_base *)this_00);
          }
          if (local_a0.payload.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
            uVar4 = 1;
            p_Var3 = local_a0.payload.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
            do {
              p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              fprintf(_stdout,"cue payload[%i]: \"%s\"\n",uVar4,p_Var3[1]._M_next);
              uVar4 = (ulong)((int)uVar4 + 1);
              p_Var3 = p_Var1;
            } while (p_Var1 != (_List_node_base *)this);
          }
          fputc(10,_stdout);
          fflush(_stdout);
        }
        main_cold_3();
        iVar2 = 1;
LAB_001034c1:
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&this->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        std::__cxx11::_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::_M_clear
                  (&this_00->
                    super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.identifier._M_dataplus._M_p != &local_a0.identifier.field_2) {
          operator_delete(local_a0.identifier._M_dataplus._M_p);
        }
      }
      else {
        main_cold_2();
        iVar2 = 1;
      }
      libwebvtt::Parser::~Parser(&local_b8);
    }
    else {
      main_cold_1();
      iVar2 = 1;
    }
    libwebvtt::VttReader::~VttReader(&VStack_c8);
  }
  else {
    fwrite("usage: dumpvtt <vtt file>\n",0x1a,1,_stdout);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc != 2) {
    fprintf(stdout, "usage: dumpvtt <vtt file>\n");
    return EXIT_SUCCESS;
  }

  libwebvtt::VttReader reader;
  const char* const filename = argv[1];

  if (int e = reader.Open(filename)) {
    (void)e;
    fprintf(stderr, "open failed\n");
    return EXIT_FAILURE;
  }

  libwebvtt::Parser parser(&reader);

  if (int e = parser.Init()) {
    (void)e;
    fprintf(stderr, "parser init failed\n");
    return EXIT_FAILURE;
  }

  for (libwebvtt::Cue cue;;) {
    const int e = parser.Parse(&cue);

    if (e < 0) {  // error
      fprintf(stderr, "error parsing cue\n");
      return EXIT_FAILURE;
    }

    if (e > 0)  // EOF
      return EXIT_SUCCESS;

    fprintf(stdout, "cue identifier: \"%s\"\n", cue.identifier.c_str());

    const libwebvtt::Time& st = cue.start_time;
    fprintf(stdout, "cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", st.hours,
            st.minutes, st.seconds, st.milliseconds);

    const libwebvtt::Time& sp = cue.stop_time;
    fprintf(stdout, "cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", sp.hours,
            sp.minutes, sp.seconds, sp.milliseconds);

    {
      typedef libwebvtt::Cue::settings_t::const_iterator iter_t;
      iter_t i = cue.settings.begin();
      const iter_t j = cue.settings.end();

      if (i == j) {
        fprintf(stdout, "cue setting: <no settings present>\n");
      } else {
        while (i != j) {
          const libwebvtt::Setting& setting = *i++;
          fprintf(stdout, "cue setting: name=%s value=%s\n",
                  setting.name.c_str(), setting.value.c_str());
        }
      }
    }

    {
      typedef libwebvtt::Cue::payload_t::const_iterator iter_t;
      iter_t i = cue.payload.begin();
      const iter_t j = cue.payload.end();

      int idx = 1;
      while (i != j) {
        const std::string& payload = *i++;
        const char* const payload_str = payload.c_str();
        fprintf(stdout, "cue payload[%i]: \"%s\"\n", idx, payload_str);
        ++idx;
      }
    }

    fprintf(stdout, "\n");
    fflush(stdout);
  }
}